

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFAcroFormDocumentHelper::adjustInheritedFields
          (QPDFAcroFormDocumentHelper *this,QPDFObjectHandle *obj,bool override_da,
          string *from_default_da,bool override_q,int from_default_q)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  string *key;
  string *key_00;
  _func_int **pp_Var4;
  string da;
  QPDFFormFieldObjectHelper cur_field;
  undefined1 local_c8 [32];
  undefined1 local_a8 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_98;
  QPDFObjectHandle local_88;
  QPDFObjectHandle local_78;
  QPDFFormFieldObjectHelper local_68;
  
  if (override_da || override_q) {
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,&local_88);
    if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (override_da) {
      pp_Var1 = (_func_int **)(local_c8 + 0x10);
      local_c8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/DA","");
      bVar2 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_68,(QPDFFormFieldObjectHelper *)local_c8,
                         key);
      if ((_func_int **)local_c8._0_8_ != pp_Var1) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if (!bVar2) {
        QPDFFormFieldObjectHelper::getDefaultAppearance_abi_cxx11_((string *)local_c8,&local_68);
        pp_Var4 = (_func_int **)local_c8._0_8_;
        if (((element_type *)local_c8._8_8_ != (element_type *)from_default_da->_M_string_length) ||
           (((element_type *)local_c8._8_8_ != (element_type *)0x0 &&
            (iVar3 = bcmp((void *)local_c8._0_8_,(from_default_da->_M_dataplus)._M_p,local_c8._8_8_)
            , iVar3 != 0)))) {
          local_a8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_c8 + 0x20),"/DA","");
          QPDFObjectHandle::newUnicodeString(&local_78,from_default_da);
          QPDFObjectHandle::replaceKey(obj,(string *)(local_c8 + 0x20),&local_78);
          if (local_78.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_78.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          pp_Var4 = (_func_int **)local_c8._0_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_,
                            (ulong)((long)(_func_int ***)local_98._vptr__Sp_counted_base + 1));
            pp_Var4 = (_func_int **)local_c8._0_8_;
          }
        }
        if (pp_Var4 != pp_Var1) {
          operator_delete(pp_Var4,(ulong)(local_c8._16_8_ + 1));
        }
      }
    }
    if (override_q) {
      pp_Var1 = (_func_int **)(local_c8 + 0x10);
      local_c8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Q","");
      bVar2 = adjustInheritedFields::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_68,(QPDFFormFieldObjectHelper *)local_c8,
                         key_00);
      if ((_func_int **)local_c8._0_8_ != pp_Var1) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      if ((!bVar2) &&
         (iVar3 = QPDFFormFieldObjectHelper::getQuadding(&local_68), iVar3 != from_default_q)) {
        local_c8._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"/Q","");
        QPDFObjectHandle::newInteger((QPDFObjectHandle *)(local_c8 + 0x20),(long)from_default_q);
        QPDFObjectHandle::replaceKey(obj,(string *)local_c8,(QPDFObjectHandle *)(local_c8 + 0x20));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
        }
        if ((_func_int **)local_c8._0_8_ != pp_Var1) {
          operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
        }
      }
    }
    QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
  }
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::adjustInheritedFields(
    QPDFObjectHandle obj,
    bool override_da,
    std::string const& from_default_da,
    bool override_q,
    int from_default_q)
{
    // Override /Q or /DA if needed. If this object has a field type, directly or inherited, it is a
    // field and not just an annotation. In that case, we need to override if we are getting a value
    // from the document that is different from the value we would have gotten from the old
    // document. We must take care not to override an explicit value. It's possible that /FT may be
    // inherited by lower fields that may explicitly set /DA or /Q or that this is a field whose
    // type does not require /DA or /Q and we may be put a value on the field that is unused. This
    // is harmless, so it's not worth trying to work around.

    auto has_explicit = [](QPDFFormFieldObjectHelper& field, std::string const& key) {
        if (field.getObjectHandle().hasKey(key)) {
            return true;
        }
        auto oh = field.getInheritableFieldValue(key);
        if (!oh.isNull()) {
            return true;
        }
        return false;
    };

    if (override_da || override_q) {
        QPDFFormFieldObjectHelper cur_field(obj);
        if (override_da && (!has_explicit(cur_field, "/DA"))) {
            std::string da = cur_field.getDefaultAppearance();
            if (da != from_default_da) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override da");
                obj.replaceKey("/DA", QPDFObjectHandle::newUnicodeString(from_default_da));
            }
        }
        if (override_q && (!has_explicit(cur_field, "/Q"))) {
            int q = cur_field.getQuadding();
            if (q != from_default_q) {
                QTC::TC("qpdf", "QPDFAcroFormDocumentHelper override q");
                obj.replaceKey("/Q", QPDFObjectHandle::newInteger(from_default_q));
            }
        }
    }
}